

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex0_task.c
# Opt level: O2

void main_task(s_awaiter_t *__awaiter_dummy__,void *arg)

{
  uint uVar1;
  
  s_task_create(g_stack0,0x80000,sub_task,(void *)0x1);
  s_task_create(g_stack1,0x80000,sub_task,(void *)0x2);
  for (uVar1 = 0; uVar1 != 4; uVar1 = uVar1 + 1) {
    printf("task_main arg = %p, i = %d\n",arg,(ulong)uVar1);
    s_task_yield(__awaiter_dummy__);
  }
  s_task_join(__awaiter_dummy__,g_stack0);
  s_task_join(__awaiter_dummy__,g_stack1);
  return;
}

Assistant:

void main_task(__async__, void* arg) {
    int i;
    s_task_create(g_stack0, sizeof(g_stack0), sub_task, (void*)1);
    s_task_create(g_stack1, sizeof(g_stack1), sub_task, (void*)2);

    for (i = 0; i < 4; ++i) {
        printf("task_main arg = %p, i = %d\n", arg, i);
        s_task_yield(__await__);
    }

    s_task_join(__await__, g_stack0);
    s_task_join(__await__, g_stack1);
}